

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

char16_t * u16tou16(char16_t *source)

{
  size_t sVar1;
  char16_t *s1;
  
  if (source == (char16_t *)0x0) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
  }
  else {
    sVar1 = strlenU16(source);
    s1 = (char16_t *)malloc(sVar1 * 2 + 1);
    if (s1 != (char16_t *)0x0) {
      strcpyU16(s1,source);
      return s1;
    }
    g_lastError = OPENJTALKERROR_MALLOC_ERROR;
  }
  return (char16_t *)0x0;
}

Assistant:

char16_t *u16tou16(const char16_t *source)
{
	if (source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	char16_t *temp = (char16_t *)malloc(strlenU16(source) * sizeof(char16_t) + 1);
	if (!temp)
	{
		g_lastError = OPENJTALKERROR_MALLOC_ERROR;
		return NULL;
	}
	return strcpyU16(temp, source);
}